

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ElementSelectExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ElementSelectExpressionSyntax *this,
          size_t index)

{
  SyntaxNode *node;
  ElementSelectSyntax *node_00;
  size_t index_local;
  ElementSelectExpressionSyntax *this_local;
  
  if (index == 0) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->left)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 1) {
    node_00 = not_null<slang::syntax::ElementSelectSyntax_*>::get(&this->select);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node_00->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ElementSelectExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return left.get();
        case 1: return select.get();
        default: return nullptr;
    }
}